

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsGFkSolve.cpp
# Opt level: O0

int __thiscall HighsGFkSolve::link(HighsGFkSolve *this,char *__from,char *__to)

{
  value_type vVar1;
  reference pvVar2;
  int iVar3;
  anon_class_8_1_8991fb9c get_row_key;
  anon_class_8_1_8991fb9c get_row_right;
  anon_class_8_1_8991fb9c get_row_left;
  undefined4 in_stack_ffffffffffffff90;
  int iVar4;
  anon_class_8_1_8991fb9c *in_stack_ffffffffffffff98;
  vector<int,_std::allocator<int>_> *pvVar5;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  HighsInt linknode;
  
  iVar3 = (int)__from;
  pvVar5 = &this->colhead;
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&this->Acol,(long)iVar3);
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](pvVar5,(long)*pvVar2);
  linknode = (HighsInt)((ulong)pvVar5 >> 0x20);
  vVar1 = *pvVar2;
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&this->Anext,(long)iVar3);
  *pvVar2 = vVar1;
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&this->Aprev,(long)iVar3);
  *pvVar2 = -1;
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&this->Acol,(long)iVar3);
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&this->colhead,(long)*pvVar2);
  *pvVar2 = iVar3;
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&this->Anext,(long)iVar3);
  if (*pvVar2 != -1) {
    in_stack_ffffffffffffffa0 = &this->Aprev;
    in_stack_ffffffffffffffac = iVar3;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&this->Anext,(long)iVar3);
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       (in_stack_ffffffffffffffa0,(long)*pvVar2);
    *pvVar2 = in_stack_ffffffffffffffac;
  }
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&this->Acol,(long)iVar3);
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&this->colsize,(long)*pvVar2);
  *pvVar2 = *pvVar2 + 1;
  iVar4 = iVar3;
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&this->Arow,(long)iVar3);
  std::vector<int,_std::allocator<int>_>::operator[](&this->rowroot,(long)*pvVar2);
  highs_splay_link<HighsGFkSolve::link(int)::__0&,HighsGFkSolve::link(int)::__1&,HighsGFkSolve::link(int)::__2&>
            (linknode,(HighsInt *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
             (anon_class_8_1_8991fb9c *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
             (anon_class_8_1_8991fb9c *)CONCAT44(iVar4,in_stack_ffffffffffffff90));
  pvVar5 = &this->rowsize;
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&this->Arow,(long)iVar3);
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](pvVar5,(long)*pvVar2);
  *pvVar2 = *pvVar2 + 1;
  return (int)pvVar2;
}

Assistant:

void HighsGFkSolve::link(HighsInt pos) {
  Anext[pos] = colhead[Acol[pos]];
  Aprev[pos] = -1;
  colhead[Acol[pos]] = pos;
  if (Anext[pos] != -1) Aprev[Anext[pos]] = pos;

  ++colsize[Acol[pos]];

  auto get_row_left = [&](HighsInt pos) -> HighsInt& { return ARleft[pos]; };
  auto get_row_right = [&](HighsInt pos) -> HighsInt& { return ARright[pos]; };
  auto get_row_key = [&](HighsInt pos) { return Acol[pos]; };
  highs_splay_link(pos, rowroot[Arow[pos]], get_row_left, get_row_right,
                   get_row_key);
  ++rowsize[Arow[pos]];
}